

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O3

SUNErrCode SUNAdaptController_Write(SUNAdaptController C,FILE *fptr)

{
  _func_SUNErrCode_SUNAdaptController_FILE_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  if (C == (SUNAdaptController)0x0) {
    return -9999;
  }
  UNRECOVERED_JUMPTABLE = C->ops->write;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNAdaptController_FILE_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(C,fptr);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write(SUNAdaptController C, FILE* fptr)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  if (C->ops->write) { ier = C->ops->write(C, fptr); }
  return (ier);
}